

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

uint Abc_TtCanonicizePhase(word *pTruth,int nVars)

{
  word wVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  
  uVar8 = 1 << ((byte)nVars - 6 & 0x1f);
  if (nVars < 7) {
    uVar8 = 1;
  }
  uVar4 = 0;
  if ((long)pTruth[(long)(int)uVar8 + -1] < 0) {
    if (0 < (int)uVar8) {
      uVar7 = 0;
      do {
        pTruth[uVar7] = ~pTruth[uVar7];
        uVar7 = uVar7 + 1;
      } while (uVar8 != uVar7);
    }
    uVar4 = 1 << ((byte)nVars & 0x1f);
  }
  uVar11 = nVars - 1;
  if (6 < nVars) {
LAB_00494452:
    uVar9 = uVar11;
    iVar12 = 1 << ((char)nVars - 7U & 0x1f);
    if (1 < (int)uVar8) {
      uVar6 = uVar8 - iVar12;
      uVar11 = uVar8;
      do {
        uVar13 = uVar11 - 1;
        uVar7 = (ulong)uVar13;
        if (pTruth[(int)(uVar13 - iVar12)] != pTruth[uVar7]) {
          if (pTruth[(int)(uVar13 - iVar12)] <= pTruth[uVar7]) {
            if (1 < uVar11) goto LAB_004944d3;
            goto LAB_00494517;
          }
          break;
        }
        uVar11 = uVar6 - iVar12;
        uVar14 = uVar11 - iVar12;
        if (uVar13 != uVar6) {
          uVar11 = uVar13;
          uVar14 = uVar6;
        }
        uVar6 = uVar14;
      } while (1 < (int)uVar11);
    }
    bVar3 = false;
    goto LAB_004944ad;
  }
LAB_0049453c:
  if (-1 < (int)uVar11) {
    uVar7 = (ulong)uVar11;
    do {
      uVar11 = 1 << ((byte)uVar7 & 0x1f);
      uVar2 = s_Truths6[uVar7];
      uVar10 = (ulong)uVar8;
      do {
        uVar15 = uVar10;
        uVar9 = 0;
        if ((int)uVar15 < 1) goto LAB_004945b1;
        bVar5 = (byte)uVar11;
        uVar17 = pTruth[uVar15 - 1] << (bVar5 & 0x3f) & uVar2;
        uVar16 = pTruth[uVar15 - 1] & uVar2;
        uVar10 = uVar15 - 1;
      } while (uVar17 == uVar16);
      if (uVar17 <= uVar16) {
        uVar10 = uVar15 - 1 & 0xffffffff;
        do {
          pTruth[uVar10] =
               (pTruth[uVar10] & uVar2) >> (bVar5 & 0x3f) | pTruth[uVar10] << (bVar5 & 0x3f) & uVar2
          ;
          uVar10 = uVar10 - 1;
          uVar6 = (int)uVar15 - 1;
          uVar15 = (ulong)uVar6;
          uVar9 = uVar11;
        } while (0 < (int)uVar6);
      }
LAB_004945b1:
      uVar4 = uVar4 ^ uVar9;
      bVar3 = 0 < (long)uVar7;
      uVar7 = uVar7 - 1;
    } while (bVar3);
  }
  return uVar4;
LAB_004944d3:
  do {
    uVar14 = (uint)uVar7;
    wVar1 = pTruth[(int)(uVar14 - iVar12)];
    pTruth[(int)(uVar14 - iVar12)] = pTruth[uVar7];
    pTruth[uVar7] = wVar1;
    uVar11 = uVar6 - iVar12;
    uVar13 = uVar11 - iVar12;
    if (uVar14 != uVar6) {
      uVar11 = uVar14;
      uVar13 = uVar6;
    }
    uVar6 = uVar13;
    uVar7 = (ulong)(uVar11 - 1);
  } while (1 < (int)uVar11);
  bVar3 = true;
  if (uVar11 != 0) {
LAB_00494517:
    __assert_fail("w == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauCanon.c"
                  ,0x3ce,"int Abc_TtCanonicizePhaseVar6(word *, int, int)");
  }
LAB_004944ad:
  uVar11 = 1 << ((byte)uVar9 & 0x1f);
  if (!bVar3) {
    uVar11 = 0;
  }
  uVar4 = uVar4 ^ uVar11;
  uVar11 = uVar9 - 1;
  nVars = uVar9;
  if ((int)uVar9 < 7) goto LAB_00494536;
  goto LAB_00494452;
LAB_00494536:
  uVar11 = 5;
  goto LAB_0049453c;
}

Assistant:

unsigned Abc_TtCanonicizePhase( word * pTruth, int nVars )
{
    unsigned uCanonPhase = 0;
    int v, nWords = Abc_TtWordNum( nVars );
//    static int Counter = 0;
//    Counter++;

#ifdef CANON_VERIFY
    static word pCopy1[1024];
    static word pCopy2[1024];
    Abc_TtCopy( pCopy1, pTruth, nWords, 0 );
#endif

    if ( (pTruth[nWords-1] >> 63) & 1 )
    {
        Abc_TtNot( pTruth, nWords );
        uCanonPhase ^= (1 << nVars);
    }

//    while ( 1 )
//    {
//        unsigned uCanonPhase2 = uCanonPhase;
        for ( v = nVars - 1; v >= 6; v-- )
            if ( Abc_TtCanonicizePhaseVar6( pTruth, nVars, v ) == 1 )
                uCanonPhase ^= 1 << v;
        for ( ; v >= 0; v-- )
            if ( Abc_TtCanonicizePhaseVar5( pTruth, nVars, v ) == 1 )
                uCanonPhase ^= 1 << v;
//        if ( uCanonPhase2 == uCanonPhase )
//            break;
//    }

//    for ( v = 5; v >= 0; v-- )
//        assert( Abc_TtCanonicizePhaseVar5( pTruth, nVars, v ) != 1 );

#ifdef CANON_VERIFY
    Abc_TtCopy( pCopy2, pTruth, nWords, 0 );
    Abc_TtImplementNpnConfig( pCopy2, nVars, NULL, uCanonPhase );
    if ( !Abc_TtEqual( pCopy1, pCopy2, nWords ) )
        printf( "Canonical form verification failed!\n" );
#endif
    return uCanonPhase;
}